

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XML88591Transcoder.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::XML88591Transcoder::transcodeTo
          (XML88591Transcoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts options)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  TranscodingException *this_00;
  XMLByte XVar3;
  XMLCh tmpBuf [17];
  XMLCh local_48 [24];
  
  if (srcCount < maxBytes) {
    maxBytes = srcCount;
  }
  if (0 < (long)maxBytes) {
    pXVar1 = srcData + maxBytes;
    do {
      XVar2 = *srcData;
      if ((ushort)XVar2 < 0x100) {
        XVar3 = (XMLByte)XVar2;
      }
      else {
        XVar3 = '\x1a';
        if (options == UnRep_Throw) {
          XMLString::binToText
                    ((uint)(ushort)XVar2,local_48,0x10,0x10,
                     (this->super_XMLTranscoder).fMemoryManager);
          this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XML88591Transcoder.cpp"
                     ,0x7f,Trans_Unrepresentable,local_48,(this->super_XMLTranscoder).fEncodingName,
                     (XMLCh *)0x0,(XMLCh *)0x0,(this->super_XMLTranscoder).fMemoryManager);
          __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
        }
      }
      *toFill = XVar3;
      srcData = srcData + 1;
      toFill = toFill + 1;
    } while (srcData < pXVar1);
  }
  *charsEaten = maxBytes;
  return maxBytes;
}

Assistant:

XMLSize_t
XML88591Transcoder::transcodeTo(const   XMLCh* const    srcData
                                , const XMLSize_t       srcCount
                                ,       XMLByte* const  toFill
                                , const XMLSize_t       maxBytes
                                ,       XMLSize_t&      charsEaten
                                , const UnRepOpts       options)
{
    //
    //  Calculate the max chars we can do here. Its the lesser of the
    //  max output bytes and the number of chars in the source.
    //
    const XMLSize_t countToDo = srcCount < maxBytes ? srcCount : maxBytes;

    //
    //  Loop through the bytes to do and convert over each byte. Its just
    //  a downcast of the wide char, checking for unrepresentable chars.
    //
    const XMLCh*    srcPtr  = srcData;
    const XMLCh*    srcEnd  = srcPtr + countToDo;
    XMLByte*        destPtr = toFill;
    while (srcPtr < srcEnd)
    {
        // If its legal, take it and jump back to top
        if (*srcPtr < 256)
        {
            *destPtr++ = XMLByte(*srcPtr++);
            continue;
        }

        //
        //  Its not representable so use a replacement char. According to
        //  the options, either throw or use the replacement.
        //
        if (options == UnRep_Throw)
        {
            XMLCh tmpBuf[17];
            XMLString::binToText((unsigned int)*srcPtr, tmpBuf, 16, 16, getMemoryManager());
            ThrowXMLwithMemMgr2
            (
                TranscodingException
                , XMLExcepts::Trans_Unrepresentable
                , tmpBuf
                , getEncodingName()
                , getMemoryManager()
            );
        }
        *destPtr++ = 0x1A;
        srcPtr++;
    }

    // Set the chars eaten
    charsEaten = countToDo;

    // Return the bytes we transcoded
    return countToDo;
}